

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O3

ON__UINT16 __thiscall
ON_Outline::Internal_AppendFigure
          (ON_Outline *this,size_t point_count_as_size_t,ON_OutlineFigurePoint *points,
          double short_tolerance,bool bSkipPointFigures)

{
  ON_2fPoint *this_00;
  ON_OutlineFigurePoint *pOVar1;
  Proximity PVar2;
  ON__UINT16 OVar3;
  float fVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  Type TVar8;
  Type TVar9;
  ON_OutlineFigure *pOVar10;
  ulong uVar11;
  ON_OutlineFigurePoint *pOVar12;
  uint uVar13;
  char *sFormat;
  long lVar14;
  ON_OutlineFigurePoint *pOVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ON_OutlineFigurePoint figure_end;
  ON_OutlineFigurePoint figure_start;
  ON_OutlineFigurePoint prev_figure_end;
  ON_OutlineFigurePoint prev_figure_start;
  ON_OutlineFigurePoint *local_c8;
  ulong local_b0;
  long local_a8;
  ON_OutlineFigurePoint local_98;
  double local_88;
  ON_OutlineFigurePoint local_78;
  ON_OutlineFigurePoint local_68;
  ON_OutlineFigurePoint local_58;
  ON_SimpleArray<ON_OutlineFigurePoint> *local_48;
  long local_40;
  ulong local_38;
  
  if (point_count_as_size_t == 0) {
    return 0;
  }
  uVar13 = (uint)point_count_as_size_t;
  if (uVar13 < 2 || points == (ON_OutlineFigurePoint *)0x0) {
    sFormat = "Invalid point_count or points[] array.";
    iVar18 = 0x59c;
    goto LAB_004907d2;
  }
  local_78.m_point.y = (points->m_point).y;
  local_78.m_point_type = points->m_point_type;
  local_78.m_point_proximity = points->m_point_proximity;
  local_78.m_figure_index = points->m_figure_index;
  local_78.m_point.x = (points->m_point).x;
  local_88 = short_tolerance;
  bVar5 = ON_OutlineFigurePoint::IsBeginFigurePoint(&local_78);
  if ((bVar5) && (bVar5 = ON_OutlineFigurePoint::IsOnFigure(&local_78), bVar5)) {
    this_00 = &local_78.m_point;
    bVar5 = ON_2fPoint::IsValid(this_00);
    if (bVar5) {
      uVar23 = (ulong)(uVar13 - 1);
      local_98.m_point.y = points[uVar23].m_point.y;
      pOVar15 = points + uVar23;
      local_98.m_point_type = pOVar15->m_point_type;
      local_98.m_point_proximity = pOVar15->m_point_proximity;
      local_98.m_figure_index = pOVar15->m_figure_index;
      local_98.m_point.x = (pOVar15->m_point).x;
      bVar5 = ON_OutlineFigurePoint::IsEndFigurePoint(&local_98);
      if (((!bVar5) || (bVar5 = ON_OutlineFigurePoint::IsOnFigure(&local_98), !bVar5)) ||
         (bVar5 = ON_2fPoint::IsValid(&local_98.m_point), !bVar5)) {
        sFormat = "points[point_count-1] is not a valid EndFigure point.";
        iVar18 = 0x5b2;
        goto LAB_004907d2;
      }
      if (bSkipPointFigures && uVar13 == 2) {
        bVar5 = ON_2fPoint::operator==(this_00,&local_98.m_point);
        if (bVar5) {
          return 0;
        }
LAB_004909fd:
        bVar5 = false;
      }
      else {
        if (uVar13 < 3) goto LAB_004909fd;
        bVar5 = false;
        if (this->m_figure_type == DoubleStroke) {
          TVar8 = ON_OutlineFigurePoint::PointType(&local_78);
          if ((TVar8 != BeginFigureClosed) ||
             (TVar8 = ON_OutlineFigurePoint::PointType(&local_98), TVar8 != EndFigureClosed))
          goto LAB_004909fd;
          bVar5 = ON_2fPoint::operator==(this_00,&local_98.m_point);
          if (3 < uVar13 && bVar5) {
            iVar18 = (this->m_figures).m_count;
            if (iVar18 != 0) {
              uVar20 = iVar18 - 1;
              pOVar10 = (this->m_figures).m_a;
              if ((pOVar10[uVar20].m_figure_type == DoubleStroke) &&
                 (pOVar10[uVar20].m_points.m_count == uVar13)) {
                pOVar15 = pOVar10[uVar20].m_points.m_a;
                local_58.m_point.y = (pOVar15->m_point).y;
                local_58._0_8_ = *(undefined8 *)pOVar15;
                pOVar15 = pOVar10[uVar20].m_points.m_a;
                local_68.m_point.y = pOVar15[uVar23].m_point.y;
                pOVar15 = pOVar15 + uVar23;
                local_68.m_point_type = pOVar15->m_point_type;
                local_68.m_point_proximity = pOVar15->m_point_proximity;
                local_68.m_figure_index = pOVar15->m_figure_index;
                local_68.m_point.x = (pOVar15->m_point).x;
                TVar8 = ON_OutlineFigurePoint::PointType(&local_58);
                if ((TVar8 == BeginFigureClosed) &&
                   (((TVar8 = ON_OutlineFigurePoint::PointType(&local_68), TVar8 == EndFigureClosed
                     && (bVar5 = ON_2fPoint::operator==((ON_2fPoint *)((long)&local_58 + 4),this_00)
                        , bVar5)) &&
                    (bVar5 = ON_2fPoint::operator==(&local_68.m_point,this_00), bVar5)))) {
                  local_48 = &pOVar10[uVar20].m_points;
                  local_38 = point_count_as_size_t & 0xffffffff;
                  local_40 = point_count_as_size_t - 1;
                  bVar5 = true;
LAB_00490943:
                  local_a8 = local_40;
                  uVar21 = 0;
                  local_c8 = points;
                  do {
                    uVar19 = (uint)local_a8;
                    if (bVar5) {
                      uVar19 = (uint)uVar21;
                    }
                    pOVar15 = pOVar10[uVar20].m_points.m_a + uVar19;
                    bVar7 = ON_OutlineFigurePoint::IsOnFigure(pOVar15);
                    bVar6 = ON_OutlineFigurePoint::IsOnFigure(local_c8);
                    if (bVar7 != bVar6) {
                      TVar8 = ON_OutlineFigurePoint::PointType(pOVar15);
                      TVar9 = ON_OutlineFigurePoint::PointType(local_c8);
                      if (TVar8 != TVar9) goto LAB_004909e6;
                    }
                    bVar7 = ON_2fPoint::operator==(&pOVar15->m_point,&local_c8->m_point);
                    if (!bVar7) goto LAB_004909e6;
                    uVar21 = uVar21 + 1;
                    local_a8 = local_a8 + -1;
                    local_c8 = local_c8 + 1;
                    if (local_38 == uVar21) {
                      pOVar15 = pOVar10[uVar20].m_points.m_a;
                      pOVar15->m_point_type = BeginFigureOpen;
                      bVar5 = ON_OutlineFigurePoint::IsOnFigure(pOVar15 + (uVar13 - 2));
                      if ((bVar5) &&
                         (bVar5 = ON_2fPoint::operator==
                                            (&local_68.m_point,
                                             &pOVar10[uVar20].m_points.m_a[uVar13 - 2].m_point),
                         !bVar5)) {
                        pOVar12 = ON_SimpleArray<ON_OutlineFigurePoint>::AppendNew(local_48);
                        uVar13 = pOVar10[uVar20].m_points.m_count - 2;
                        pOVar1 = pOVar10[uVar20].m_points.m_a;
                        pOVar1[uVar13].m_point_type = LineTo;
                        pOVar15 = pOVar1 + uVar13;
                        PVar2 = pOVar15->m_point_proximity;
                        OVar3 = pOVar15->m_figure_index;
                        fVar4 = (pOVar15->m_point).x;
                        pOVar12->m_point_type = pOVar15->m_point_type;
                        pOVar12->m_point_proximity = PVar2;
                        pOVar12->m_figure_index = OVar3;
                        (pOVar12->m_point).x = fVar4;
                        (pOVar12->m_point).y = pOVar1[uVar13].m_point.y;
                        pOVar12->m_point_type = EndFigureOpen;
                      }
                      pOVar10[uVar20].m_figure_type = SingleStroke;
                      return pOVar10[uVar20].m_figure_index;
                    }
                  } while( true );
                }
              }
            }
LAB_004909f9:
            bVar5 = true;
          }
        }
      }
      pOVar10 = ON_ClassArray<ON_OutlineFigure>::AppendNew(&this->m_figures);
      pOVar10->m_figure_index = (ON__UINT16)(this->m_figures).m_count;
      pOVar10->m_short_tolerance =
           (double)(~-(ulong)(0.0 < local_88) & (ulong)this->m_short_tolerance |
                   (ulong)local_88 & -(ulong)(0.0 < local_88));
      ON_SimpleArray<ON_OutlineFigurePoint>::Append(&pOVar10->m_points,uVar13,points);
      pOVar15 = (pOVar10->m_points).m_a;
      (pOVar15->m_point).y = local_78.m_point.y;
      pOVar15->m_point_type = local_78.m_point_type;
      pOVar15->m_point_proximity = local_78.m_point_proximity;
      pOVar15->m_figure_index = local_78.m_figure_index;
      (pOVar15->m_point).x = local_78.m_point.x;
      pOVar10->m_figure_type = this->m_figure_type;
      pOVar10->m_units_per_em = this->m_units_per_em;
      if (bVar5 == false) goto LAB_00490e93;
      local_58._0_8_ = ON_2fPoint::NanPoint;
      uVar20 = uVar13 - 3;
      if (uVar20 == 0) {
        bVar5 = false;
        uVar23 = 2;
      }
      else {
        uVar21 = (ulong)uVar20;
        local_88 = (double)(uVar21 * 3);
        bVar5 = ON_OutlineFigurePoint::IsOnFigure((pOVar10->m_points).m_a + uVar21);
        if (!bVar5) {
          uVar11 = (ulong)(uVar13 - 2);
          bVar5 = ON_OutlineFigurePoint::IsOnFigure((pOVar10->m_points).m_a + uVar11);
          if ((bVar5) &&
             (bVar5 = ON_2fPoint::operator==
                                (&(pOVar10->m_points).m_a[uVar11].m_point,&local_98.m_point), bVar5)
             ) {
            bVar5 = false;
            uVar23 = uVar11;
            goto LAB_00490bad;
          }
        }
        bVar5 = ON_OutlineFigurePoint::IsOnFigure((pOVar10->m_points).m_a + uVar21);
        if ((bVar5) &&
           (bVar5 = ON_2fPoint::operator==
                              ((ON_2fPoint *)
                               (&(((pOVar10->m_points).m_a)->m_point).x + (long)local_88),this_00),
           bVar5)) {
          uVar19 = uVar13 - 2;
          bVar5 = ON_OutlineFigurePoint::IsOnFigure((pOVar10->m_points).m_a + uVar19);
          if ((bVar5) &&
             (TVar8 = ON_OutlineFigurePoint::PointType((pOVar10->m_points).m_a + uVar19),
             TVar8 == LineTo)) {
            local_58._0_8_ = (pOVar10->m_points).m_a[uVar19].m_point;
            bVar5 = ON_2fPoint::operator==((ON_2fPoint *)&local_58,&local_98.m_point);
            bVar5 = !bVar5;
            uVar23 = (ulong)uVar20;
            goto LAB_00490bad;
          }
        }
        bVar5 = false;
      }
LAB_00490bad:
      uVar20 = (uint)uVar23;
      if ((uVar23 & 1) == 0 && uVar20 != 0) {
        pOVar15 = (pOVar10->m_points).m_a;
        bVar7 = ON_2fPoint::operator==(&pOVar15->m_point,&pOVar15[uVar23].m_point);
        uVar21 = 0;
        if (bVar7) {
          uVar21 = 0;
          uVar11 = 0;
          local_b0 = uVar23;
          while( true ) {
            uVar20 = (uint)uVar23;
            bVar7 = ON_OutlineFigurePoint::IsOnFigure((pOVar10->m_points).m_a + uVar21);
            uVar21 = uVar11;
            if ((!bVar7) ||
               (bVar7 = ON_OutlineFigurePoint::IsOnFigure((pOVar10->m_points).m_a + local_b0),
               !bVar7)) break;
            uVar22 = (ulong)((int)uVar11 + 1);
            local_88 = (double)(uVar22 * 0xc);
            uVar24 = (ulong)(uVar20 - 1);
            lVar17 = 0;
            uVar23 = uVar24;
            lVar14 = 0;
            uVar11 = uVar22;
            do {
              uVar21 = uVar11;
              lVar16 = lVar14;
              local_b0 = uVar23;
              uVar20 = (uint)local_b0;
              if (uVar20 <= (uint)uVar21) goto LAB_00490d8c;
              bVar7 = ON_OutlineFigurePoint::IsOnFigure
                                ((ON_OutlineFigurePoint *)
                                 (&((pOVar10->m_points).m_a)->m_point_type + lVar16 + (long)local_88
                                 ));
              if ((bVar7) ||
                 (bVar7 = ON_OutlineFigurePoint::IsOnFigure
                                    ((ON_OutlineFigurePoint *)
                                     (&(pOVar10->m_points).m_a[uVar24].m_point_type + lVar17)),
                 bVar7)) break;
              TVar8 = ON_OutlineFigurePoint::PointType
                                ((ON_OutlineFigurePoint *)
                                 (&((pOVar10->m_points).m_a)->m_point_type + lVar16 + (long)local_88
                                 ));
              TVar9 = ON_OutlineFigurePoint::PointType
                                ((ON_OutlineFigurePoint *)
                                 (&(pOVar10->m_points).m_a[uVar24].m_point_type + lVar17));
              if (TVar8 != TVar9) break;
              pOVar15 = (pOVar10->m_points).m_a;
              bVar7 = ON_2fPoint::operator==
                                ((ON_2fPoint *)
                                 ((long)&(pOVar15->m_point).x + lVar16 + (long)local_88),
                                 (ON_2fPoint *)((long)&pOVar15[uVar24].m_point.x + lVar17));
              lVar17 = lVar17 + -0xc;
              uVar23 = local_b0 - 1;
              lVar14 = lVar16 + 0xc;
              uVar11 = uVar21 + 1;
            } while (bVar7);
            pOVar15 = (pOVar10->m_points).m_a;
            bVar7 = ON_2fPoint::operator==
                              ((ON_2fPoint *)((long)&pOVar15[uVar22].m_point.x + lVar16),
                               (ON_2fPoint *)((long)pOVar15 + (uVar24 * 0xc - lVar16) + 4));
            uVar11 = uVar21 & 0xffffffff;
            uVar23 = local_b0 & 0xffffffff;
            if (!bVar7) break;
          }
        }
LAB_00490d8c:
        uVar19 = (uint)uVar21;
        if (uVar19 == uVar20) {
          uVar21 = uVar21 & 0xffffffff;
          bVar7 = ON_OutlineFigurePoint::IsOnFigure((pOVar10->m_points).m_a + uVar21);
          if (((bVar7) &&
              (bVar7 = ON_OutlineFigurePoint::IsEndFigurePoint((pOVar10->m_points).m_a + uVar21),
              !bVar7)) && (uVar20 = uVar19 + 2, uVar20 <= uVar13)) {
            if (bVar5) {
              uVar20 = uVar19 + 3;
              if (uVar13 < uVar20) goto LAB_00490e93;
              uVar19 = uVar19 + 1;
              if (uVar19 == 0) {
                uVar21 = 0;
              }
              else {
                uVar21 = (ulong)uVar19;
                lVar14 = uVar21 * 0xc;
                do {
                  pOVar15 = (pOVar10->m_points).m_a;
                  *(undefined4 *)((long)&(pOVar15->m_point).y + lVar14) =
                       *(undefined4 *)((long)pOVar15 + lVar14 + -4);
                  *(undefined8 *)(&pOVar15->m_point_type + lVar14) =
                       *(undefined8 *)(&pOVar15[-1].m_point_type + lVar14);
                  lVar14 = lVar14 + -0xc;
                } while (lVar14 != 0);
              }
              ((pOVar10->m_points).m_a)->m_point = (ON_2fPoint)local_58._0_8_;
              pOVar15 = (pOVar10->m_points).m_a;
              pOVar15[1].m_point_type = LineTo;
            }
            else {
              pOVar15 = (pOVar10->m_points).m_a;
            }
            pOVar15->m_point_type = BeginFigureOpen;
            pOVar15[uVar19 + 1].m_point = pOVar15[uVar21].m_point;
            pOVar15 = (pOVar10->m_points).m_a + (uVar19 + 1);
            pOVar15->m_point_type = EndFigureOpen;
            pOVar15->m_point_proximity = OnFigure;
            pOVar10->m_figure_type = SingleStroke;
            if ((-1 < (int)uVar20) && ((int)uVar20 <= (pOVar10->m_points).m_capacity)) {
              (pOVar10->m_points).m_count = uVar20;
            }
          }
        }
      }
LAB_00490e93:
      this->m_sorted_figure_outer_orientation = Unset;
      return pOVar10->m_figure_index;
    }
  }
  sFormat = "points[0] is not a valid BeginFigure point.";
  iVar18 = 0x5a7;
LAB_004907d2:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
             ,iVar18,"",sFormat);
  return 0;
LAB_004909e6:
  bVar7 = !bVar5;
  bVar5 = false;
  if (bVar7) goto LAB_004909f9;
  goto LAB_00490943;
}

Assistant:

ON__UINT16 ON_Outline::Internal_AppendFigure(
  size_t point_count_as_size_t,
  const ON_OutlineFigurePoint* points,
  double short_tolerance,
  bool bSkipPointFigures
)
{
  if (0 == point_count_as_size_t)
    return 0;
  
  const unsigned int point_count = (unsigned int)point_count_as_size_t;

  if (point_count < 2 || nullptr == points)
  {
    ON_ERROR("Invalid point_count or points[] array.");
    return 0;
  }

  const ON_OutlineFigurePoint figure_start = points[0];
  if (
    false == figure_start.IsBeginFigurePoint()
    || false == figure_start.IsOnFigure()
    || false == figure_start.m_point.IsValid()
    )
  {
    ON_ERROR("points[0] is not a valid BeginFigure point.");
    return 0;
  }

  const ON_OutlineFigurePoint figure_end = points[point_count-1];
  if (
    false == figure_end.IsEndFigurePoint()
    || false == figure_end.IsOnFigure()
    || false == figure_end.m_point.IsValid()
    )
  {
    ON_ERROR("points[point_count-1] is not a valid EndFigure point.");
    return 0;
  }

  if (bSkipPointFigures && 2 == point_count && figure_start.m_point == figure_end.m_point)
    return 0;

  const bool bDoubleStrokeReductionTest
    = ON_OutlineFigure::Type::DoubleStroke == m_figure_type
    && point_count >= 3
    && ON_OutlineFigurePoint::Type::BeginFigureClosed == figure_start.PointType()
    && ON_OutlineFigurePoint::Type::EndFigureClosed == figure_end.PointType()
    && figure_start.m_point == figure_end.m_point;

  while (
    bDoubleStrokeReductionTest
    && point_count >= 4
    && m_figures.UnsignedCount() > 0
    )
  {
    ON_OutlineFigure& prev_figure = m_figures[m_figures.UnsignedCount() - 1];
    if (ON_OutlineFigure::Type::DoubleStroke != prev_figure.m_figure_type)
      break;
    if (point_count != (prev_figure.m_points.UnsignedCount()))
      break;
    const ON_OutlineFigurePoint prev_figure_start = prev_figure.m_points[0];
    const ON_OutlineFigurePoint prev_figure_end = prev_figure.m_points[point_count-1];
    if (ON_OutlineFigurePoint::Type::BeginFigureClosed != prev_figure_start.PointType())
      break;
    if (ON_OutlineFigurePoint::Type::EndFigureClosed != prev_figure_end.PointType())
      break;
    if (false == (prev_figure_start.m_point == figure_start.m_point) )
      break;
    if (false == (prev_figure_end.m_point == figure_start.m_point) )
      break;

    for (int dup_check_pass = 0; dup_check_pass < 2; dup_check_pass++)
    {
      bool bDuplicateLoop = true;
      for (unsigned int i = 0; i < point_count; i++)
      {
        const unsigned int j = (0 == dup_check_pass) ? i : (point_count - i - 1);
        const ON_OutlineFigurePoint& prev_point = prev_figure.m_points[j];
        bDuplicateLoop
          = (prev_point.IsOnFigure() == points[i].IsOnFigure() || prev_point.PointType() == points[i].PointType())
          && prev_point.m_point == points[i].m_point;
        if (false == bDuplicateLoop)
          break;
      }
      if (false == bDuplicateLoop)
        continue;

      // This figure is the double stroke duplicate of the previous figure (double stroke glphys like O).
      prev_figure.m_points[0].m_point_type = ON_OutlineFigurePoint::Type::BeginFigureOpen;
      if (
        prev_figure.m_points[point_count - 2].IsOnFigure()
        && false == (prev_figure_end.m_point == prev_figure.m_points[point_count - 2].m_point)
        )
      {
        ON_OutlineFigurePoint& new_figure_end = prev_figure.m_points.AppendNew();
        ON_OutlineFigurePoint& p = prev_figure.m_points[prev_figure.m_points.UnsignedCount() - 2];
        p.m_point_type = ON_OutlineFigurePoint::Type::LineTo;
        new_figure_end = p;
        new_figure_end.m_point_type = ON_OutlineFigurePoint::Type::EndFigureOpen;
      }
      prev_figure.m_figure_type = ON_OutlineFigure::Type::SingleStroke;
      return prev_figure.FigureIndex();
    }
    break;
  }
  
  ON_OutlineFigure& figure = m_figures.AppendNew();
  figure.m_figure_index = (ON__UINT16)m_figures.UnsignedCount();
  figure.m_short_tolerance = (short_tolerance>0.0) ? short_tolerance : m_short_tolerance;
  figure.m_points.Append((int)point_count, points);
  figure.m_points[0] = figure_start;
  figure.m_figure_type = m_figure_type;
  figure.m_units_per_em = this->m_units_per_em;

  while (bDoubleStrokeReductionTest)
  {
    // check for a double stroke figure like those in CamBam Stick fonts
    unsigned int i0 = 0;

    ON_2fPoint Qpoint(ON_2fPoint::NanPoint);
    bool bPrependQseg = false;
    unsigned int i1 = (unsigned int)(point_count - 1);
    if (i1 - 2 > 0)
    {
      if (
        false == figure.m_points[i1 - 2].IsOnFigure()
        && figure.m_points[i1 - 1].IsOnFigure()
        && figure.m_points[i1 - 1].m_point == figure_end.m_point
        )
      {
        i1--;
      }
      else if (
        figure.m_points[i1 - 2].IsOnFigure()
        && figure.m_points[i1 - 2].m_point == figure_start.m_point
        && figure.m_points[i1 - 1].IsOnFigure()
        && ON_OutlineFigurePoint::Type::LineTo == figure.m_points[i1 - 1].PointType()
        )
      {
        Qpoint = figure.m_points[i1 - 1].m_point;
        if (false == (Qpoint == figure_end.m_point))
          bPrependQseg = true;
        i1 -= 2;
      }
    }
   
    if (i0 >= i1)
      break;

    if (0 != (i1 - i0) % 2)
      break;

    while (i0 < i1)
    {
      if (false == (figure.m_points[i0].m_point == figure.m_points[i1].m_point))
        break;
      if (false == figure.m_points[i0].IsOnFigure() || false == figure.m_points[i1].IsOnFigure())
        break;
      i0++;
      i1--;
      while (
        i0 < i1
        && false == figure.m_points[i0].IsOnFigure()
        && false == figure.m_points[i1].IsOnFigure()
        && figure.m_points[i0].PointType() == figure.m_points[i1].PointType()
        && figure.m_points[i0].m_point == figure.m_points[i1].m_point
        )
      {
        i0++;
        i1--;
      }
    }
    if (i0 != i1)
      break;
    if (false == figure.m_points[i1].IsOnFigure())
      break;
    if (figure.m_points[i1].IsEndFigurePoint())
      break;
    if ((size_t)(i1 + 2) > point_count)
      break;

    if ( bPrependQseg )
    {
      if ((i1 + 3) > point_count)
        break;
      for (unsigned int i = i1 + 1; i > 0; i--)
        figure.m_points[i] = figure.m_points[i - 1];
      figure.m_points[0].m_point = Qpoint;
      figure.m_points[1].m_point_type = ON_OutlineFigurePoint::Type::LineTo;
      i1++;
    }
    figure.m_points[0].m_point_type = ON_OutlineFigurePoint::Type::BeginFigureOpen;
    figure.m_points[i1 + 1].m_point = figure.m_points[i1].m_point;
    figure.m_points[i1 + 1].m_point_type = ON_OutlineFigurePoint::Type::EndFigureOpen;
    figure.m_points[i1 + 1].m_point_proximity = ON_OutlineFigurePoint::Proximity::OnFigure;
    figure.m_figure_type = ON_OutlineFigure::Type::SingleStroke;
    figure.m_points.SetCount(i1 + 2);

    break;
  }

  m_sorted_figure_outer_orientation = ON_OutlineFigure::Orientation::Unset;
  return figure.m_figure_index;
}